

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS ref_cell_create(REF_CELL *ref_cell_ptr,REF_CELL_TYPE type)

{
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_CELL ref_cell;
  int local_20;
  REF_INT max;
  REF_INT cell;
  REF_CELL_TYPE type_local;
  REF_CELL *ref_cell_ptr_local;
  
  *ref_cell_ptr = (REF_CELL)0x0;
  pRVar1 = (REF_CELL)malloc(0x48);
  *ref_cell_ptr = pRVar1;
  if (*ref_cell_ptr == (REF_CELL)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x1bb,
           "ref_cell_create","malloc *ref_cell_ptr of REF_CELL_STRUCT NULL");
    ref_cell_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_cell_ptr;
    ref_cell_ptr_local._4_4_ = ref_cell_initialize(pRVar1,type);
    if (ref_cell_ptr_local._4_4_ == 0) {
      pRVar1->n = 0;
      pRVar1->max = 100;
      if (pRVar1->max * pRVar1->size_per < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x1c7,"ref_cell_create","malloc ref_cell->c2n of REF_INT negative");
        ref_cell_ptr_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)(pRVar1->max * pRVar1->size_per) << 2);
        pRVar1->c2n = pRVar2;
        if (pRVar1->c2n == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                 0x1c7,"ref_cell_create","malloc ref_cell->c2n of REF_INT NULL");
          ref_cell_ptr_local._4_4_ = 2;
        }
        else {
          for (local_20 = 0; local_20 < 100; local_20 = local_20 + 1) {
            pRVar1->c2n[pRVar1->size_per * local_20] = -1;
            pRVar1->c2n[pRVar1->size_per * local_20 + 1] = local_20 + 1;
          }
          pRVar1->c2n[pRVar1->size_per * 99 + 1] = -1;
          pRVar1->blank = 0;
          ref_cell_ptr_local._4_4_ = ref_adj_create(&pRVar1->ref_adj);
          if (ref_cell_ptr_local._4_4_ == 0) {
            ref_cell_ptr_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
                   0x1d0,"ref_cell_create",(ulong)ref_cell_ptr_local._4_4_,
                   "create ref_adj for ref_cell");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",0x1bf,
             "ref_cell_create",(ulong)ref_cell_ptr_local._4_4_,"init");
    }
  }
  return ref_cell_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cell_create(REF_CELL *ref_cell_ptr, REF_CELL_TYPE type) {
  REF_INT cell;
  REF_INT max;
  REF_CELL ref_cell;

  (*ref_cell_ptr) = NULL;

  ref_malloc(*ref_cell_ptr, 1, REF_CELL_STRUCT);

  ref_cell = (*ref_cell_ptr);

  RSS(ref_cell_initialize(ref_cell, type), "init");

  max = 100;

  ref_cell_n(ref_cell) = 0;
  ref_cell_max(ref_cell) = max;

  ref_malloc(ref_cell->c2n,
             ref_cell_max(ref_cell) * ref_cell_size_per(ref_cell), REF_INT);

  for (cell = 0; cell < max; cell++) {
    ref_cell_c2n(ref_cell, 0, cell) = REF_EMPTY;
    ref_cell_c2n(ref_cell, 1, cell) = cell + 1;
  }
  ref_cell_c2n(ref_cell, 1, max - 1) = REF_EMPTY;
  ref_cell_blank(ref_cell) = 0;

  RSS(ref_adj_create(&(ref_cell->ref_adj)), "create ref_adj for ref_cell");

  return REF_SUCCESS;
}